

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_simd_three_reg_same(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *pTVar1;
  TCGContext_conflict1 *pTVar2;
  code *pcVar3;
  byte bVar4;
  _Bool _Var5;
  uint uVar6;
  TCGTemp *pTVar7;
  TCGTemp *ts;
  TCGTemp *ts_00;
  long lVar8;
  GVecGen4_conflict1 *pGVar9;
  ushort uVar10;
  uint opcode;
  uint uVar11;
  uint32_t uVar12;
  uintptr_t o_5;
  long lVar13;
  TCGArg a3;
  TCGCond cond;
  ulong uVar14;
  uint32_t uVar15;
  GVecGen3_conflict1 *pGVar16;
  uint32_t uVar17;
  TCGArg a3_00;
  uint uVar18;
  int is_s;
  uint uVar19;
  long lVar20;
  long lVar21;
  int is_2;
  uint uVar22;
  uint rd;
  uint32_t dofs;
  uint32_t uVar23;
  uintptr_t o_1;
  uintptr_t o;
  TCGArg local_c0;
  
  opcode = insn >> 0xb & 0x1f;
  uVar10 = (ushort)opcode;
  bVar4 = (byte)(insn >> 0x18);
  if (uVar10 < 0x20) {
    if ((0xff000000U >> opcode & 1) != 0) {
      uVar18 = insn >> 0x1e & 1;
      uVar6 = insn >> 0x16 & 1;
      if (uVar6 != 0 && (bVar4 >> 6 & 1) == 0) goto LAB_006a81c6;
      pTVar1 = s->uc->tcg_ctx;
      uVar19 = insn >> 0x17 & 1;
      uVar22 = insn >> 0x1d & 1;
      opcode = uVar22 << 6 | uVar19 << 5 | opcode;
      uVar11 = insn >> 5 & 0x1f;
      if (opcode < 0x40) {
        if ((0xc7000000df000000U >> ((ulong)opcode & 0x3f) & 1) != 0) {
LAB_006a7e82:
          if (s->fp_access_checked == true) goto LAB_006a8b2d;
          s->fp_access_checked = true;
          uVar15 = s->fp_excp_el;
          if (uVar15 == 0) {
            handle_3same_float(s,uVar6,uVar18 * 0x40 + 0x40 >> (char)uVar6 + 5,opcode,insn & 0x1f,
                               uVar11,insn >> 0x10 & 0x1f);
            return;
          }
          goto LAB_006a802a;
        }
        if ((0x2000000020000000U >> ((ulong)opcode & 0x3f) & 1) == 0) goto LAB_006a7dcb;
      }
      else {
LAB_006a7dcb:
        uVar14 = (ulong)(opcode - 0x58);
        if (0x26 < opcode - 0x58) goto LAB_006a81c6;
        if ((0x34000000b8U >> (uVar14 & 0x3f) & 1) != 0) goto LAB_006a7e82;
        if ((0x4100000045U >> (uVar14 & 0x3f) & 1) != 0) {
          uVar6 = uVar6 | 2;
          uVar19 = 0;
LAB_006a7fa3:
          handle_simd_3same_pair
                    (s,uVar18,uVar19,opcode,uVar6,uVar11,insn >> 0x10 & 0x1f,insn & 0x1f);
          return;
        }
        if ((0x200000002U >> (uVar14 & 0x3f) & 1) == 0) goto LAB_006a81c6;
      }
      if ((uVar6 == 0) && ((s->isar->id_aa64isar0 & 0xf000000000000) != 0)) {
        _Var5 = fp_access_check(s);
        if (!_Var5) {
          return;
        }
        tcg_gen_gvec_3_ptr_aarch64
                  (pTVar1,(insn & 0x1f) * 0x100 + 0xc10,uVar11 * 0x100 + 0xc10,
                   (insn >> 0x10 & 0x1f) * 0x100 + 0xc10,pTVar1->cpu_env,uVar18 * 8 + 8,s->sve_len,
                   uVar19 + uVar22 * 2,gen_helper_gvec_fmlal_a64);
        return;
      }
      goto LAB_006a81c6;
    }
    if ((0xb00000U >> opcode & 1) != 0) {
      uVar18 = insn >> 0x1e & 1;
      uVar19 = insn >> 0x1d & 1;
      uVar6 = insn >> 0x16 & 3;
      if (opcode == 0x17) {
        if ((uVar19 != 0) || (uVar6 == 3 && uVar18 == 0)) goto LAB_006a81c6;
      }
      else if (uVar6 == 3) goto LAB_006a81c6;
      uVar11 = insn >> 5 & 0x1f;
      goto LAB_006a7fa3;
    }
    if (opcode == 3) {
      if (s->fp_access_checked == true) goto LAB_006a8b2d;
      s->fp_access_checked = true;
      uVar15 = s->fp_excp_el;
      if (uVar15 == 0) {
        (*(code *)(&DAT_00d82860 +
                  *(int *)(&DAT_00d82860 + (ulong)(insn >> 0x1b & 4 | insn >> 0x16 & 3) * 4)))
                  (s->uc->tcg_ctx,&DAT_00d82860,
                   &DAT_00d82860 +
                   *(int *)(&DAT_00d82860 + (ulong)(insn >> 0x1b & 4 | insn >> 0x16 & 3) * 4),
                   s->sve_len,0,(insn >> 0x1b & 8) + 8);
        return;
      }
      goto LAB_006a802a;
    }
  }
  pTVar1 = s->uc->tcg_ctx;
  uVar11 = insn >> 0x1e;
  uVar18 = insn >> 0x1d & 1;
  uVar6 = insn >> 0x16 & 3;
  if (uVar10 < 0x17) {
    if ((0x4f015U >> opcode & 1) == 0) {
      if (opcode != 0x13) {
        if (opcode != 0x16) goto LAB_006a819e;
        if ((uVar6 == 3) || (uVar6 == 0)) goto LAB_006a81c6;
        goto LAB_006a8007;
      }
      if (uVar6 != 0 && uVar18 != 0) goto LAB_006a81c6;
    }
    if (uVar6 == 3) {
LAB_006a81c6:
      unallocated_encoding_aarch64(s);
      return;
    }
  }
  else {
LAB_006a819e:
    if ((uVar11 & 1) == 0 && uVar6 == 3) goto LAB_006a81c6;
  }
LAB_006a8007:
  if (s->fp_access_checked == true) {
LAB_006a8b2d:
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  uVar15 = s->fp_excp_el;
  if (uVar15 != 0) {
LAB_006a802a:
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,uVar15);
    return;
  }
  uVar22 = insn >> 0x10 & 0x1f;
  uVar19 = insn >> 5 & 0x1f;
  rd = insn & 0x1f;
  switch(opcode) {
  case 1:
    dofs = rd * 0x100 + 0xc10;
    uVar17 = uVar19 * 0x100 + 0xc10;
    uVar23 = uVar22 * 0x100 + 0xc10;
    uVar15 = (uVar11 & 1) * 8 + 8;
    uVar12 = s->sve_len;
    if (uVar18 == 0) {
      pGVar9 = sqadd_op_aarch64;
    }
    else {
      pGVar9 = uqadd_op_aarch64;
    }
    goto LAB_006a8722;
  default:
    if (uVar6 == 3) {
      if ((uVar11 & 1) == 0) {
        __assert_fail("is_q",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                      ,0x2d3b,"void disas_simd_3same_int(DisasContext *, uint32_t)");
      }
      lVar13 = 0;
      do {
        pTVar7 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
        ts = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
        ts_00 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
        pTVar2 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_ld_i64,
                            (TCGArg)((long)pTVar2 + ((long)pTVar7 - (long)pTVar1)),
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),
                            (ulong)(uVar19 * 0x100 + 0xc10) + lVar13);
        pTVar2 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_ld_i64,
                            (TCGArg)((long)pTVar2 + ((long)ts - (long)pTVar1)),
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),
                            (ulong)(uVar22 * 0x100 + 0xc10) + lVar13);
        handle_3same_64(s,opcode,SUB41(uVar18,0),(TCGv_i64)((long)ts_00 - (long)pTVar1),
                        (TCGv_i64)((long)pTVar7 - (long)pTVar1),(TCGv_i64)((long)ts - (long)pTVar1))
        ;
        pTVar2 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_st_i64,
                            (TCGArg)((TCGv_i64)((long)ts_00 - (long)pTVar1) + (long)pTVar2),
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),
                            (ulong)(rd * 0x100 + 0xc10) + lVar13);
        tcg_temp_free_internal_aarch64(pTVar1,ts_00);
        tcg_temp_free_internal_aarch64(pTVar1,pTVar7);
        tcg_temp_free_internal_aarch64(pTVar1,ts);
        lVar13 = lVar13 + 8;
      } while (lVar13 == 8);
    }
    else {
      lVar13 = (ulong)(uVar11 & 1) * 2 + 2;
      local_c0 = (TCGArg)(rd * 0x100 + 0xc10);
      a3_00 = (ulong)(uVar22 << 8) + 0xc10;
      a3 = (ulong)(uVar19 << 8) + 0xc10;
      do {
        pTVar7 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
        lVar20 = (long)pTVar7 - (long)pTVar1;
        pTVar7 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
        lVar8 = (long)pTVar7 - (long)pTVar1;
        pTVar7 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
        pTVar2 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_ld_i32,(long)pTVar2 + lVar20,
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),a3);
        pTVar2 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_ld_i32,(long)pTVar2 + lVar8,
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),a3_00);
        if (uVar10 < 0x10) {
          (*(code *)(&DAT_00d828cc + *(int *)(&DAT_00d828cc + (ulong)opcode * 4)))();
          return;
        }
        if (opcode != 0x16) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,0x2daa,(char *)0x0);
        }
        if (1 < uVar6 - 1) {
          __assert_fail("size == 1 || size == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                        ,0x2da5,"void disas_simd_3same_int(DisasContext *, uint32_t)");
        }
        pcVar3 = *(code **)((long)disas_simd_scalar_three_reg_same::fns_4[uVar6 - 1] +
                           (ulong)(uVar18 << 3));
        lVar21 = (long)pTVar7 - (long)pTVar1;
        if (pcVar3 == (code *)0x0) {
          (*(code *)0x0)(pTVar1,lVar21,lVar20,lVar8);
        }
        else {
          (*pcVar3)(pTVar1,lVar21,pTVar1->cpu_env,lVar20,lVar8);
        }
        pTVar2 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_st_i32,(long)pTVar2 + lVar21,
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),local_c0);
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(lVar21 + (long)pTVar1));
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(lVar20 + (long)pTVar1));
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(lVar8 + (long)pTVar1));
        local_c0 = local_c0 + 4;
        a3_00 = a3_00 + 4;
        a3 = a3 + 4;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    clear_vec_high(s,(_Bool)(bVar4 >> 6 & 1),rd);
    return;
  case 5:
    dofs = rd * 0x100 + 0xc10;
    uVar17 = uVar19 * 0x100 + 0xc10;
    uVar23 = uVar22 * 0x100 + 0xc10;
    uVar15 = (uVar11 & 1) * 8 + 8;
    uVar12 = s->sve_len;
    if (uVar18 == 0) {
      pGVar9 = sqsub_op_aarch64;
    }
    else {
      pGVar9 = uqsub_op_aarch64;
    }
LAB_006a8722:
    tcg_gen_gvec_4_aarch64
              (pTVar1,dofs,0x2e50,uVar17,uVar23,uVar15,uVar12,
               (GVecGen4_conflict1 *)((long)&pGVar9->fni8 + (ulong)(uVar6 * 0x30)));
    break;
  case 6:
    cond = uVar18 * 2 + TCG_COND_GT;
    goto LAB_006a84e4;
  case 7:
    cond = uVar18 * 2 + TCG_COND_GE;
    goto LAB_006a84e4;
  case 8:
    _Var5 = (_Bool)(bVar4 >> 6 & 1);
    if (uVar18 == 0) {
      pGVar16 = sshl_op_aarch64;
    }
    else {
      pGVar16 = ushl_op_aarch64;
    }
    pGVar16 = (GVecGen3_conflict1 *)((long)&pGVar16->fni8 + (ulong)(uVar6 * 0x30));
    goto LAB_006a8782;
  case 0xc:
    uVar23 = rd * 0x100 + 0xc10;
    uVar12 = uVar19 * 0x100 + 0xc10;
    uVar17 = uVar22 * 0x100 + 0xc10;
    uVar15 = (uVar11 & 1) * 8 + 8;
    if (uVar18 == 0) {
      tcg_gen_gvec_smax_aarch64(pTVar1,uVar6,uVar23,uVar12,uVar17,uVar15,s->sve_len);
    }
    else {
      tcg_gen_gvec_umax_aarch64(pTVar1,uVar6,uVar23,uVar12,uVar17,uVar15,s->sve_len);
    }
    break;
  case 0xd:
    uVar23 = rd * 0x100 + 0xc10;
    uVar12 = uVar19 * 0x100 + 0xc10;
    uVar17 = uVar22 * 0x100 + 0xc10;
    uVar15 = (uVar11 & 1) * 8 + 8;
    if (uVar18 == 0) {
      tcg_gen_gvec_smin_aarch64(pTVar1,uVar6,uVar23,uVar12,uVar17,uVar15,s->sve_len);
    }
    else {
      tcg_gen_gvec_umin_aarch64(pTVar1,uVar6,uVar23,uVar12,uVar17,uVar15,s->sve_len);
    }
    break;
  case 0x10:
    uVar23 = rd * 0x100 + 0xc10;
    uVar12 = uVar19 * 0x100 + 0xc10;
    uVar17 = uVar22 * 0x100 + 0xc10;
    uVar15 = (uVar11 & 1) * 8 + 8;
    if (uVar18 == 0) {
      tcg_gen_gvec_add_aarch64(pTVar1,uVar6,uVar23,uVar12,uVar17,uVar15,s->sve_len);
    }
    else {
      tcg_gen_gvec_sub_aarch64(pTVar1,uVar6,uVar23,uVar12,uVar17,uVar15,s->sve_len);
    }
    break;
  case 0x11:
    cond = TCG_COND_EQ;
    if (uVar18 == 0) {
      _Var5 = (_Bool)(bVar4 >> 6 & 1);
      pGVar16 = (GVecGen3_conflict1 *)((long)&cmtst_op_aarch64[0].fni8 + (ulong)(uVar6 * 0x30));
      goto LAB_006a8782;
    }
LAB_006a84e4:
    tcg_gen_gvec_cmp_aarch64
              (pTVar1,cond,uVar6,rd * 0x100 + 0xc10,uVar19 * 0x100 + 0xc10,uVar22 * 0x100 + 0xc10,
               (uVar11 & 1) * 8 + 8,s->sve_len);
    break;
  case 0x12:
    _Var5 = (_Bool)(bVar4 >> 6 & 1);
    if (uVar18 == 0) {
      pGVar16 = (GVecGen3_conflict1 *)((long)&mla_op_aarch64[0].fni8 + (ulong)(uVar6 * 0x30));
    }
    else {
      pGVar16 = (GVecGen3_conflict1 *)((long)&mls_op_aarch64[0].fni8 + (ulong)(uVar6 * 0x30));
    }
LAB_006a8782:
    gen_gvec_op3(s,_Var5,rd,uVar19,uVar22,pGVar16);
    return;
  case 0x13:
    if (uVar18 == 0) {
      tcg_gen_gvec_mul_aarch64
                (pTVar1,uVar6,rd * 0x100 + 0xc10,uVar19 * 0x100 + 0xc10,uVar22 * 0x100 + 0xc10,
                 (uVar11 & 1) * 8 + 8,s->sve_len);
    }
    else {
      gen_gvec_op3_ool(s,(_Bool)(bVar4 >> 6 & 1),rd,uVar19,uVar22,0,gen_helper_gvec_pmul_b);
    }
  }
  return;
}

Assistant:

static void disas_simd_three_reg_same(DisasContext *s, uint32_t insn)
{
    int opcode = extract32(insn, 11, 5);

    switch (opcode) {
    case 0x3: /* logic ops */
        disas_simd_3same_logic(s, insn);
        break;
    case 0x17: /* ADDP */
    case 0x14: /* SMAXP, UMAXP */
    case 0x15: /* SMINP, UMINP */
    {
        /* Pairwise operations */
        int is_q = extract32(insn, 30, 1);
        int u = extract32(insn, 29, 1);
        int size = extract32(insn, 22, 2);
        int rm = extract32(insn, 16, 5);
        int rn = extract32(insn, 5, 5);
        int rd = extract32(insn, 0, 5);
        if (opcode == 0x17) {
            if (u || (size == 3 && !is_q)) {
                unallocated_encoding(s);
                return;
            }
        } else {
            if (size == 3) {
                unallocated_encoding(s);
                return;
            }
        }
        handle_simd_3same_pair(s, is_q, u, opcode, size, rn, rm, rd);
        break;
    }
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
        /* floating point ops, sz[1] and U are part of opcode */
        disas_simd_3same_float(s, insn);
        break;
    default:
        disas_simd_3same_int(s, insn);
        break;
    }
}